

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O0

rawSeq duckdb_zstd::maybeSplitSequence(rawSeqStore_t *rawSeqStore,U32 remaining,U32 minMatch)

{
  rawSeq rVar1;
  rawSeq *prVar2;
  uint in_EDX;
  uint in_ESI;
  rawSeqStore_t *in_RDI;
  rawSeq sequence;
  undefined8 local_c;
  uint local_4;
  
  prVar2 = in_RDI->seq + in_RDI->pos;
  local_c._0_4_ = prVar2->offset;
  local_c._4_4_ = prVar2->litLength;
  local_4 = prVar2->matchLength;
  if (in_ESI < local_c._4_4_ + local_4) {
    if ((uint)local_c._4_4_ < in_ESI) {
      if ((in_ESI < local_c._4_4_ + local_4) && (local_4 = in_ESI - local_c._4_4_, local_4 < in_EDX)
         ) {
        local_c = (ulong)(uint)local_c._4_4_ << 0x20;
      }
    }
    else {
      local_c = (ulong)(uint)local_c._4_4_ << 0x20;
    }
    ZSTD_ldm_skipSequences(in_RDI,(ulong)in_ESI,in_EDX);
  }
  else {
    in_RDI->pos = in_RDI->pos + 1;
  }
  rVar1.matchLength = local_4;
  rVar1.offset = (undefined4)local_c;
  rVar1.litLength = local_c._4_4_;
  return rVar1;
}

Assistant:

static rawSeq maybeSplitSequence(rawSeqStore_t* rawSeqStore,
                                 U32 const remaining, U32 const minMatch)
{
    rawSeq sequence = rawSeqStore->seq[rawSeqStore->pos];
    assert(sequence.offset > 0);
    /* Likely: No partial sequence */
    if (remaining >= sequence.litLength + sequence.matchLength) {
        rawSeqStore->pos++;
        return sequence;
    }
    /* Cut the sequence short (offset == 0 ==> rest is literals). */
    if (remaining <= sequence.litLength) {
        sequence.offset = 0;
    } else if (remaining < sequence.litLength + sequence.matchLength) {
        sequence.matchLength = remaining - sequence.litLength;
        if (sequence.matchLength < minMatch) {
            sequence.offset = 0;
        }
    }
    /* Skip past `remaining` bytes for the future sequences. */
    ZSTD_ldm_skipSequences(rawSeqStore, remaining, minMatch);
    return sequence;
}